

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O2

int Abc_NodeResubMffc(Abc_ManRst_t *p,Vec_Ptr_t *vDecs,int nLeaves,Abc_Obj_t *pRoot)

{
  uint i;
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  void *Entry;
  int iVar4;
  
  Abc_NtkIncrementTravId(pRoot->pNtk);
  iVar1 = 0;
  iVar4 = 0;
  if (0 < nLeaves) {
    iVar1 = nLeaves;
    iVar4 = 0;
  }
  for (; iVar1 != iVar4; iVar4 = iVar4 + 1) {
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(vDecs,iVar4);
    Abc_NodeSetTravIdCurrent(pAVar3);
  }
  iVar1 = Abc_NodeTravId(pRoot);
  if (iVar1 != pRoot->pNtk->nTravIds + -1) {
    __assert_fail("Abc_NodeIsTravIdPrevious(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRestruct.c"
                  ,0x497,"int Abc_NodeResubMffc(Abc_ManRst_t *, Vec_Ptr_t *, int, Abc_Obj_t *)");
  }
  iVar4 = Abc_NodeResubMffc_rec(pRoot);
  p->vTemp->nSize = 0;
  iVar1 = 0;
  for (; nLeaves < vDecs->nSize; nLeaves = nLeaves + 1) {
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(vDecs,nLeaves);
    iVar2 = Abc_NodeIsTravIdCurrent(pAVar3);
    if (iVar2 == 0) {
      Vec_PtrWriteEntry(vDecs,iVar1,pAVar3);
      iVar1 = iVar1 + 1;
    }
    else {
      Vec_PtrPush(p->vTemp,pAVar3);
    }
  }
  iVar2 = 0;
  while( true ) {
    i = iVar1 + iVar2;
    if (p->vTemp->nSize <= iVar2) break;
    Entry = Vec_PtrEntry(p->vTemp,iVar2);
    Vec_PtrWriteEntry(vDecs,i,Entry);
    iVar2 = iVar2 + 1;
  }
  if (i == p->vDecs->nSize) {
    if ((int)i < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
    }
    if ((Abc_Obj_t *)p->vDecs->pArray[(ulong)i - 1] == pRoot) {
      return iVar4;
    }
    __assert_fail("pRoot == Vec_PtrEntryLast(p->vDecs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRestruct.c"
                  ,0x4a5,"int Abc_NodeResubMffc(Abc_ManRst_t *, Vec_Ptr_t *, int, Abc_Obj_t *)");
  }
  __assert_fail("k == Vec_PtrSize(p->vDecs)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRestruct.c"
                ,0x4a4,"int Abc_NodeResubMffc(Abc_ManRst_t *, Vec_Ptr_t *, int, Abc_Obj_t *)");
}

Assistant:

int Abc_NodeResubMffc( Abc_ManRst_t * p, Vec_Ptr_t * vDecs, int nLeaves, Abc_Obj_t * pRoot )
{
    Abc_Obj_t * pObj;
    int Counter, i, k;
    // increment the traversal ID for the leaves
    Abc_NtkIncrementTravId( pRoot->pNtk );
    // label the leaves
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vDecs, pObj, i, nLeaves )
        Abc_NodeSetTravIdCurrent( pObj ); 
    // make sure the node is in the cone and is no one of the leaves
    assert( Abc_NodeIsTravIdPrevious(pRoot) );
    Counter = Abc_NodeResubMffc_rec( pRoot );
    // move the labeled nodes to the end 
    Vec_PtrClear( p->vTemp );
    k = 0;
    Vec_PtrForEachEntryStart( Abc_Obj_t *, vDecs, pObj, i, nLeaves )
        if ( Abc_NodeIsTravIdCurrent(pObj) )
            Vec_PtrPush( p->vTemp, pObj );
        else
            Vec_PtrWriteEntry( vDecs, k++, pObj );
    // add the labeled nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vTemp, pObj, i )
        Vec_PtrWriteEntry( vDecs, k++, pObj );
    assert( k == Vec_PtrSize(p->vDecs) );
    assert( pRoot == Vec_PtrEntryLast(p->vDecs) );
    return Counter;
}